

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::flush_variable_declaration(CompilerGLSL *this,uint32_t id)

{
  StorageClass SVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *var;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string expr;
  string initializer;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  var = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (var != (SPIRVariable *)0x0) {
    if (var->deferred_declaration == true) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      if ((((this->options).force_zero_initialized_variables == true) &&
          (var->storage - StorageClassPrivate < 3)) && ((var->initializer).id == 0)) {
        type = Compiler::get_variable_data_type(&this->super_Compiler,var);
        bVar2 = type_can_zero_initialize(this,type);
        if (bVar2) {
          uVar3 = Compiler::get_variable_data_type_id(&this->super_Compiler,var);
          ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this->super_Compiler)._vptr_Compiler;
          (*(code *)ts_1[0xe]._M_string_length)(local_40,this,uVar3);
          join<char_const(&)[4],std::__cxx11::string>
                    (&local_80,(spirv_cross *)0x3b58ce,(char (*) [4])local_40,ts_1);
          ::std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
          ::std::__cxx11::string::~string((string *)&local_80);
          ::std::__cxx11::string::~string(local_40);
        }
      }
      SVar1 = var->storage;
      var->storage = StorageClassFunction;
      (*(this->super_Compiler)._vptr_Compiler[0x27])(&local_80,this,var);
      var->storage = SVar1;
      statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,&local_80,&local_60,(char (*) [2])0x39d4f0);
      ::std::__cxx11::string::~string((string *)&local_80);
      var->deferred_declaration = false;
      ::std::__cxx11::string::~string((string *)&local_60);
    }
    emit_variable_temporary_copies(this,var);
  }
  return;
}

Assistant:

void CompilerGLSL::flush_variable_declaration(uint32_t id)
{
	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->deferred_declaration)
	{
		string initializer;
		if (options.force_zero_initialized_variables &&
		    (var->storage == StorageClassFunction || var->storage == StorageClassGeneric ||
		     var->storage == StorageClassPrivate) &&
		    !var->initializer && type_can_zero_initialize(get_variable_data_type(*var)))
		{
			initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(*var)));
		}

		statement(variable_decl_function_local(*var), initializer, ";");
		var->deferred_declaration = false;
	}
	if (var)
	{
		emit_variable_temporary_copies(*var);
	}
}